

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void highbd_transpose16x16_avx2(__m256i *x,__m256i *d)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  undefined1 auVar7 [32];
  __m256i dd [16];
  undefined1 auStack_340 [16];
  undefined1 auStack_330 [240];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  auVar1 = vpunpcklwd_avx2((undefined1  [32])*x,(undefined1  [32])x[1]);
  auVar2 = vpunpcklwd_avx2((undefined1  [32])x[2],(undefined1  [32])x[3]);
  auVar7 = vpunpcklwd_avx2((undefined1  [32])x[4],(undefined1  [32])x[5]);
  auVar3 = vpunpcklwd_avx2((undefined1  [32])x[6],(undefined1  [32])x[7]);
  auVar4 = vpunpckldq_avx2(auVar1,auVar2);
  auVar5 = vpunpckldq_avx2(auVar7,auVar3);
  local_240 = vpunpcklqdq_avx2(auVar4,auVar5);
  local_220 = vpunpckhqdq_avx2(auVar4,auVar5);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx2(auVar7,auVar3);
  local_200 = vpunpcklqdq_avx2(auVar1,auVar2);
  local_1e0 = vpunpckhqdq_avx2(auVar1,auVar2);
  auVar1 = vpunpckhwd_avx2((undefined1  [32])*x,(undefined1  [32])x[1]);
  auVar2 = vpunpckhwd_avx2((undefined1  [32])x[2],(undefined1  [32])x[3]);
  auVar7 = vpunpckhwd_avx2((undefined1  [32])x[4],(undefined1  [32])x[5]);
  auVar3 = vpunpckhwd_avx2((undefined1  [32])x[6],(undefined1  [32])x[7]);
  auVar4 = vpunpckldq_avx2(auVar1,auVar2);
  auVar5 = vpunpckldq_avx2(auVar7,auVar3);
  local_1c0 = vpunpcklqdq_avx2(auVar4,auVar5);
  local_1a0 = vpunpckhqdq_avx2(auVar4,auVar5);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx2(auVar7,auVar3);
  local_180 = vpunpcklqdq_avx2(auVar1,auVar2);
  local_160 = vpunpckhqdq_avx2(auVar1,auVar2);
  auVar1 = vpunpcklwd_avx2((undefined1  [32])x[8],(undefined1  [32])x[9]);
  auVar2 = vpunpcklwd_avx2((undefined1  [32])x[10],(undefined1  [32])x[0xb]);
  auVar7 = vpunpcklwd_avx2((undefined1  [32])x[0xc],(undefined1  [32])x[0xd]);
  auVar3 = vpunpcklwd_avx2((undefined1  [32])x[0xe],(undefined1  [32])x[0xf]);
  auVar4 = vpunpckldq_avx2(auVar1,auVar2);
  auVar5 = vpunpckldq_avx2(auVar7,auVar3);
  local_140 = vpunpcklqdq_avx2(auVar4,auVar5);
  local_120 = vpunpckhqdq_avx2(auVar4,auVar5);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx2(auVar7,auVar3);
  local_100 = vpunpcklqdq_avx2(auVar1,auVar2);
  local_e0 = vpunpckhqdq_avx2(auVar1,auVar2);
  auVar1 = vpunpckhwd_avx2((undefined1  [32])x[8],(undefined1  [32])x[9]);
  auVar2 = vpunpckhwd_avx2((undefined1  [32])x[10],(undefined1  [32])x[0xb]);
  auVar7 = vpunpckhwd_avx2((undefined1  [32])x[0xc],(undefined1  [32])x[0xd]);
  auVar3 = vpunpckhwd_avx2((undefined1  [32])x[0xe],(undefined1  [32])x[0xf]);
  auVar4 = vpunpckldq_avx2(auVar1,auVar2);
  auVar5 = vpunpckldq_avx2(auVar7,auVar3);
  local_c0 = vpunpcklqdq_avx2(auVar4,auVar5);
  local_a0 = vpunpckhqdq_avx2(auVar4,auVar5);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx2(auVar7,auVar3);
  local_80 = vpunpcklqdq_avx2(auVar1,auVar2);
  local_60 = vpunpckhqdq_avx2(auVar1,auVar2);
  for (lVar6 = 0x100; lVar6 != 0x200; lVar6 = lVar6 + 0x20) {
    auVar1 = *(undefined1 (*) [32])(local_240 + lVar6);
    auVar2 = vperm2i128_avx2(auVar1,*(undefined1 (*) [32])(auStack_340 + lVar6),2);
    auVar7._0_16_ =
         ZEXT116(1) * *(undefined1 (*) [16])(auStack_330 + lVar6) + ZEXT116(0) * auVar1._0_16_;
    auVar7._16_16_ =
         ZEXT116(1) * auVar1._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])(auStack_330 + lVar6);
    *(undefined1 (*) [32])((long)d[-8] + lVar6) = auVar2;
    *(undefined1 (*) [32])((long)*d + lVar6) = auVar7;
  }
  return;
}

Assistant:

static inline void highbd_transpose16x16_avx2(__m256i *x, __m256i *d) {
  __m256i w0, w1, w2, w3, ww0, ww1;
  __m256i dd[16];
  w0 = _mm256_unpacklo_epi16(x[0], x[1]);
  w1 = _mm256_unpacklo_epi16(x[2], x[3]);
  w2 = _mm256_unpacklo_epi16(x[4], x[5]);
  w3 = _mm256_unpacklo_epi16(x[6], x[7]);

  ww0 = _mm256_unpacklo_epi32(w0, w1);  //
  ww1 = _mm256_unpacklo_epi32(w2, w3);  //

  dd[0] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[1] = _mm256_unpackhi_epi64(ww0, ww1);

  ww0 = _mm256_unpackhi_epi32(w0, w1);  //
  ww1 = _mm256_unpackhi_epi32(w2, w3);  //

  dd[2] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[3] = _mm256_unpackhi_epi64(ww0, ww1);

  w0 = _mm256_unpackhi_epi16(x[0], x[1]);
  w1 = _mm256_unpackhi_epi16(x[2], x[3]);
  w2 = _mm256_unpackhi_epi16(x[4], x[5]);
  w3 = _mm256_unpackhi_epi16(x[6], x[7]);

  ww0 = _mm256_unpacklo_epi32(w0, w1);  //
  ww1 = _mm256_unpacklo_epi32(w2, w3);  //

  dd[4] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[5] = _mm256_unpackhi_epi64(ww0, ww1);

  ww0 = _mm256_unpackhi_epi32(w0, w1);  //
  ww1 = _mm256_unpackhi_epi32(w2, w3);  //

  dd[6] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[7] = _mm256_unpackhi_epi64(ww0, ww1);

  w0 = _mm256_unpacklo_epi16(x[8], x[9]);
  w1 = _mm256_unpacklo_epi16(x[10], x[11]);
  w2 = _mm256_unpacklo_epi16(x[12], x[13]);
  w3 = _mm256_unpacklo_epi16(x[14], x[15]);

  ww0 = _mm256_unpacklo_epi32(w0, w1);
  ww1 = _mm256_unpacklo_epi32(w2, w3);

  dd[8] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[9] = _mm256_unpackhi_epi64(ww0, ww1);

  ww0 = _mm256_unpackhi_epi32(w0, w1);
  ww1 = _mm256_unpackhi_epi32(w2, w3);

  dd[10] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[11] = _mm256_unpackhi_epi64(ww0, ww1);

  w0 = _mm256_unpackhi_epi16(x[8], x[9]);
  w1 = _mm256_unpackhi_epi16(x[10], x[11]);
  w2 = _mm256_unpackhi_epi16(x[12], x[13]);
  w3 = _mm256_unpackhi_epi16(x[14], x[15]);

  ww0 = _mm256_unpacklo_epi32(w0, w1);
  ww1 = _mm256_unpacklo_epi32(w2, w3);

  dd[12] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[13] = _mm256_unpackhi_epi64(ww0, ww1);

  ww0 = _mm256_unpackhi_epi32(w0, w1);
  ww1 = _mm256_unpackhi_epi32(w2, w3);

  dd[14] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[15] = _mm256_unpackhi_epi64(ww0, ww1);

  for (int i = 0; i < 8; i++) {
    d[i] = _mm256_insertf128_si256(dd[i], _mm256_castsi256_si128(dd[i + 8]), 1);
    d[i + 8] = _mm256_insertf128_si256(dd[i + 8],
                                       _mm256_extracti128_si256(dd[i], 1), 0);
  }
}